

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

long boyi_search(char n_w,char n_b,char (*board) [8],char s,char f,long a,long b)

{
  char cVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char acStackY_508 [1088];
  long local_c0;
  long local_b8;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  long arg_d;
  long arg_now;
  char local_88 [7];
  char rev;
  char new_board [8] [8];
  long lStack_40;
  char rs;
  long arg_m;
  char num;
  char j;
  char i;
  long lStack_30;
  char n;
  long a_local;
  char f_local;
  char s_local;
  char (*board_local) [8];
  char n_b_local;
  char n_w_local;
  
  if ((char)(n_w + n_b) == '@') {
    if (AI_COLOR == 5) {
      if (n_b < n_w) {
        local_a4 = -1000000;
      }
      else {
        local_a4 = 0;
        if (n_w < n_b) {
          local_a4 = 1000000;
        }
      }
      return (long)local_a4;
    }
    if (AI_COLOR == 4) {
      if (n_w < n_b) {
        local_a8 = -1000000;
      }
      else {
        local_a8 = 0;
        if (n_b < n_w) {
          local_a8 = 1000000;
        }
      }
      return (long)local_a8;
    }
  }
  if ((chess_num[0] + chess_num[1] + MODE_DEPTH[MODE] <= (int)(char)(n_w + n_b)) &&
     (chess_num[0] + chess_num[1] <= 0x40 - MODE_DEPTH_END[MODE])) {
    return 0;
  }
  arg_m._4_1_ = '\0';
  if (f == '\x01') {
    arg_m._4_1_ = (char)num_now[AI_COLOR + -4];
  }
  else {
    for (arg_m._6_1_ = '\0'; arg_m._6_1_ < '\b'; arg_m._6_1_ = arg_m._6_1_ + '\x01') {
      for (arg_m._5_1_ = '\0'; arg_m._5_1_ < '\b'; arg_m._5_1_ = arg_m._5_1_ + '\x01') {
        if ((board[arg_m._6_1_][arg_m._5_1_] != '\x04') &&
           (board[arg_m._6_1_][arg_m._5_1_] != '\x05')) {
          iVar2 = canrev((int)arg_m._6_1_,(int)arg_m._5_1_,board,(int)s,0);
          if (iVar2 < 1) {
            board[arg_m._6_1_][arg_m._5_1_] = '\0';
          }
          else {
            board[arg_m._6_1_][arg_m._5_1_] = s + -3;
            arg_m._4_1_ = arg_m._4_1_ + '\x01';
          }
        }
      }
    }
  }
  new_board[7][7] = '\x04';
  if (s == '\x04') {
    new_board[7][7] = '\x05';
  }
  memcpy(local_88,board,0x40);
  if (arg_m._4_1_ == '\0') {
    if (f != '\x02') {
      lVar3 = boyi_search(n_w,n_b,(char (*) [8])local_88,new_board[7][7],'\x02',a,b);
      return lVar3;
    }
    if (AI_COLOR == 5) {
      if (n_b < n_w) {
        local_ac = -1000000;
      }
      else {
        local_ac = 0;
        if (n_w < n_b) {
          local_ac = 1000000;
        }
      }
      return (long)local_ac;
    }
    if (AI_COLOR == 4) {
      if (n_w < n_b) {
        local_b0 = -1000000;
      }
      else {
        local_b0 = 0;
        if (n_b < n_w) {
          local_b0 = 1000000;
        }
      }
      return (long)local_b0;
    }
  }
  arg_m._4_1_ = '\0';
  arg_m._6_1_ = '\0';
  lStack_30 = a;
  do {
    if ('\a' < arg_m._6_1_) {
      return lStack_40;
    }
    for (arg_m._5_1_ = '\0'; arg_m._5_1_ < '\b'; arg_m._5_1_ = arg_m._5_1_ + '\x01') {
      if (f == '\x01') {
        if (((int)chessboard[arg_m._6_1_][arg_m._5_1_] == AI_COLOR + -3) ||
           (chessboard[arg_m._6_1_][arg_m._5_1_] == '\x03')) {
LAB_00101d8b:
          iVar2 = canrev((int)arg_m._6_1_,(int)arg_m._5_1_,(char (*) [8])local_88,(int)s,1);
          cVar1 = (char)iVar2;
          local_88[(long)arg_m._5_1_ + (long)arg_m._6_1_ * 8] = s;
          if (arg_m._4_1_ != '\0') {
            if (s == AI_COLOR) {
              if (arg_d < lStack_30) {
                local_b8 = lStack_30;
              }
              else {
                local_b8 = arg_d;
              }
              lStack_30 = local_b8;
            }
            else {
              if (b < arg_d) {
                local_c0 = b;
              }
              else {
                local_c0 = arg_d;
              }
              b = local_c0;
            }
          }
          lVar3 = getarg((int)arg_m._6_1_,(int)arg_m._5_1_,(int)s);
          if (s == '\x05') {
            lVar4 = boyi_search(n_w - cVar1,n_b + cVar1 + '\x01',(char (*) [8])local_88,
                                new_board[7][7],'\0',lStack_30 - lVar3,b - lVar3);
          }
          else {
            lVar4 = boyi_search(n_w + cVar1 + '\x01',n_b - cVar1,(char (*) [8])local_88,
                                new_board[7][7],'\0',lStack_30 - lVar3,b - lVar3);
          }
          arg_d = lVar4 + lVar3;
          if (((int)s == 9 - AI_COLOR) && (arg_d <= lStack_30)) {
            return lStack_30;
          }
          if ((s == AI_COLOR) && (b <= arg_d)) {
            return b;
          }
          if ((((arg_m._4_1_ == '\0') || ((s == AI_COLOR && (lStack_40 < arg_d)))) ||
              (((int)s == 9 - AI_COLOR && (arg_d < lStack_40)))) && (lStack_40 = arg_d, f == '\x01')
             ) {
            boyi_max_x = (int)arg_m._6_1_;
            boyi_max_y = (int)arg_m._5_1_;
          }
          arg_m._4_1_ = arg_m._4_1_ + '\x01';
          memcpy(local_88,board,0x40);
        }
      }
      else if ((int)board[arg_m._6_1_][arg_m._5_1_] == s + -3) goto LAB_00101d8b;
    }
    arg_m._6_1_ = arg_m._6_1_ + '\x01';
  } while( true );
}

Assistant:

long boyi_search(char n_w, char n_b, char board[][SIZE], char s, char f, long a, long b) {
    char n = n_w + n_b;
    char i, j;
    if (n == SIZE * SIZE) {
        if (AI_COLOR == BLACK) {
            return (n_w > n_b ? -1000000 : (n_w < n_b ? 1000000 : 0));
        }
        if (AI_COLOR == WHITE) {
            return (n_w < n_b ? -1000000 : (n_w > n_b ? 1000000 : 0));
        }
/*#ifdef AI_COLOR_BLACK
		return (n_w > n_b ? -1000000 : (n_w < n_b ? 1000000 : 0));
#endif
#ifdef AI_COLOR_WHITE
		return (n_w < n_b ? -1000000 : (n_w > n_b ? 1000000 : 0));
#endif*/
    }
/*#if (AI_MODE==MODE_EASY)
	if (n >= chess_num[0] + chess_num[1] + 2 && chess_num[0] + chess_num[1] <= SIZE*SIZE - 3)
#elif (AI_MODE==MODE_NORM)
	if (n >= chess_num[0] + chess_num[1] + 5 && chess_num[0] + chess_num[1] <= SIZE*SIZE - 6)
#elif (AI_MODE==MODE_HARD)
	if (n >= chess_num[0] + chess_num[1] + 8 && chess_num[0] + chess_num[1] <= SIZE*SIZE - 12)
#elif (AI_MODE==MODE_HELL)
	if (n >= chess_num[0] + chess_num[1] + 10 && chess_num[0] + chess_num[1] <= SIZE*SIZE - 12)
#endif*/
    if (n >= chess_num[0] + chess_num[1] + MODE_DEPTH[MODE] &&
        chess_num[0] + chess_num[1] <= SIZE * SIZE - MODE_DEPTH_END[MODE]) {
        return 0;
    }
    char num = 0;
    if (f != 1) {
        for (i = 0; i < SIZE; i++) {
            for (j = 0; j < SIZE; j++) {
                if (board[i][j] != WHITE && board[i][j] != BLACK) {
                    if (canrev(i, j, board, s, 0) > 0) {
                        board[i][j] = s - 3;
                        num++;
                    } else {
                        board[i][j] = EMPTY;
                    }
                }
            }
        }
    } else {
        num = num_now[COLOR_bin(AI_COLOR)];
/*#ifdef AI_COLOR_BLACK
		num = num_now[1];
#endif
#ifdef AI_COLOR_WHITE
		num = num_now[0];
#endif*/
    }
    long arg_m;
    char rs = (s == WHITE ? BLACK : WHITE);
    char new_board[SIZE][SIZE];
    memcpy(new_board, board, SIZE * SIZE);
    if (num == 0) {
        if (f == 2) {
            if (AI_COLOR == BLACK) {
                return (n_w > n_b ? -1000000 : (n_w < n_b ? 1000000 : 0));
            }
            if (AI_COLOR == WHITE) {
                return (n_w < n_b ? -1000000 : (n_w > n_b ? 1000000 : 0));
            }
/*#ifdef AI_COLOR_BLACK
			return (n_w > n_b ? -1000000 : (n_w < n_b ? 1000000 : 0));
#endif
#ifdef AI_COLOR_WHITE
			return (n_w < n_b ? -1000000 : (n_w > n_b ? 1000000 : 0));
#endif*/
        } else {
            return boyi_search(n_w, n_b, new_board, rs, 2, a, b);
        }
    }
    num = 0;
    for (i = 0; i < SIZE; i++) {
        for (j = 0; j < SIZE; j++) {
            if (f == 1) {
                if (chessboard[i][j] != COLOR_(AI_COLOR) && chessboard[i][j] != BOTH)
/*#ifdef AI_COLOR_BLACK
				if (chessboard[i][j] != BLACK_&&chessboard[i][j] != BOTH)
#endif
#ifdef AI_COLOR_WHITE
				if (chessboard[i][j] != WHITE_&&chessboard[i][j] != BOTH)
#endif*/
                {
                    continue;
                }
            } else {
                if (board[i][j] != s - 3) {
                    continue;
                }
            }
            char rev = canrev(i, j, new_board, s, 1);
            new_board[i][j] = s;
            long arg_now;
            if (num != 0) {
                if (s == AI_COLOR)
/*#ifdef AI_COLOR_BLACK
				if (s == BLACK)
#endif
#ifdef AI_COLOR_WHITE
				if (s == WHITE)
#endif*/
                {
                    a = max(a, arg_now);
                } else {
                    b = min(b, arg_now);
                }
            }
            long arg_d = getarg(i, j, s);
            if (s == BLACK) {
                arg_now = boyi_search(n_w - rev, n_b + rev + 1, new_board, rs, 0, a - arg_d, b - arg_d) + arg_d;
            } else {
                arg_now = boyi_search(n_w + rev + 1, n_b - rev, new_board, rs, 0, a - arg_d, b - arg_d) + arg_d;
            }
            if (s == COLOR_rev(AI_COLOR) && arg_now <= a)//alpha
/*#ifdef AI_COLOR_BLACK
			if (s == WHITE&&arg_now <= a)//alpha
#endif
#ifdef AI_COLOR_WHITE
			if (s == BLACK&&arg_now <= a)//alpha
#endif*/
            {
                return a;
            }
            if (s == AI_COLOR && arg_now >= b)//beita
/*#ifdef AI_COLOR_BLACK
			if (s == BLACK&&arg_now >= b)//beita
#endif
#ifdef AI_COLOR_WHITE
			if (s == WHITE&&arg_now >= b)//beita
#endif*/
            {
                return b;
            }
            if (num == 0 || s == AI_COLOR && arg_now > arg_m || s == COLOR_rev(AI_COLOR) && arg_now < arg_m)
/*#ifdef AI_COLOR_BLACK
			if (num == 0 || s == BLACK &&arg_now > arg_m || s == WHITE&&arg_now < arg_m)
#endif
#ifdef AI_COLOR_WHITE
			if (num == 0 || s == BLACK &&arg_now < arg_m || s == WHITE&&arg_now > arg_m)
#endif*/
            {
                arg_m = arg_now;
                if (f == 1) {
                    boyi_max_x = i;
                    boyi_max_y = j;
                }
            }
            num++;
            memcpy(new_board, board, SIZE * SIZE);
        }
    }
    return arg_m;
}